

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O3

int __thiscall QStackedLayout::insertWidget(QStackedLayout *this,int index,QWidget *widget)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int index_00;
  long lVar4;
  long in_FS_OFFSET;
  int local_4c;
  QWidgetItem *local_48;
  int *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QLayout).field_0x8;
  QLayout::addChildWidget(&this->super_QLayout,widget);
  lVar3 = *(long *)(lVar2 + 0xc0);
  lVar4 = (long)index;
  if (lVar3 < index) {
    lVar4 = lVar3;
  }
  if (-1 < (int)lVar4) {
    lVar3 = lVar4;
  }
  index_00 = (int)lVar3;
  local_48 = QLayoutPrivate::createWidgetItem(&this->super_QLayout,widget);
  QtPrivate::QPodArrayOps<QLayoutItem*>::emplace<QLayoutItem*&>
            ((QPodArrayOps<QLayoutItem*> *)(lVar2 + 0xb0),(long)index_00,(QLayoutItem **)&local_48);
  QList<QLayoutItem_*>::begin((QList<QLayoutItem_*> *)(lVar2 + 0xb0));
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  iVar1 = *(int *)(lVar2 + 200);
  if (iVar1 < 0) {
    setCurrentIndex(this,index_00);
  }
  else {
    if (index_00 <= iVar1) {
      *(int *)(lVar2 + 200) = iVar1 + 1;
    }
    if (*(int *)(lVar2 + 0xcc) == 0) {
      QWidget::hide(widget);
    }
    QWidget::lower(widget);
  }
  local_40 = &local_4c;
  local_48 = (QWidgetItem *)0x0;
  local_4c = index_00;
  QMetaObject::activate((QObject *)this,&staticMetaObject,2,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return index_00;
  }
  __stack_chk_fail();
}

Assistant:

int QStackedLayout::insertWidget(int index, QWidget *widget)
{
    Q_D(QStackedLayout);
    addChildWidget(widget);
    index = qMin(index, d->list.size());
    if (index < 0)
        index = d->list.size();
    QWidgetItem *wi = QLayoutPrivate::createWidgetItem(this, widget);
    d->list.insert(index, wi);
    invalidate();
    if (d->index < 0) {
        setCurrentIndex(index);
    } else {
        if (index <= d->index)
            ++d->index;
        if (d->stackingMode == StackOne)
            widget->hide();
        widget->lower();
    }
    emit widgetAdded(index);
    return index;
}